

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O0

void __thiscall
Importer_addModelToLibrary_Test::Importer_addModelToLibrary_Test
          (Importer_addModelToLibrary_Test *this)

{
  Importer_addModelToLibrary_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Importer_addModelToLibrary_Test_001a11a0;
  return;
}

Assistant:

TEST(Importer, addModelToLibrary)
{
    // This test shows how a model instance can be manually added to the import library by the user,
    // and will be used to resolve imports, rather than from an external file/URL.
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("importer/generic_no_source.cellml"));
    auto importer = libcellml::Importer::create();

    auto sourceModel = libcellml::Model::create("source");
    sourceModel->addComponent(libcellml::Component::create("a"));
    sourceModel->addComponent(libcellml::Component::create("b"));
    sourceModel->addComponent(libcellml::Component::create("c"));
    sourceModel->addComponent(libcellml::Component::create("d"));

    // Add a model manually to the library, including the URL that it will replace in future imports.
    EXPECT_TRUE(importer->addModel(sourceModel, "i_dont_exist.cellml"));

    // Can't add to the same URL key more than once.
    EXPECT_FALSE(importer->addModel(sourceModel, "i_dont_exist.cellml"));

    importer->resolveImports(model, "");

    EXPECT_EQ(size_t(0), importer->issueCount());
    EXPECT_FALSE(model->hasUnresolvedImports());
}